

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

void tcptran_pipe_nego_cb(void *arg)

{
  nni_aio *pnVar1;
  tcptran_ep *ep;
  ulong uVar2;
  nng_err nVar3;
  size_t sVar4;
  nng_err result;
  long *plVar5;
  undefined1 local_38 [8];
  nni_iov iov;
  
  ep = *(tcptran_ep **)((long)arg + 0x38);
  nni_mtx_lock(&ep->mtx);
  nVar3 = NNG_ECLOSED;
  if (ep->closed != false) goto LAB_00129903;
  pnVar1 = (nni_aio *)((long)arg + 0x430);
  nVar3 = nni_aio_result(pnVar1);
  if (nVar3 != NNG_OK) goto LAB_00129903;
  if (*(ulong *)((long)arg + 0x50) < *(ulong *)((long)arg + 0x60)) {
    plVar5 = (long *)((long)arg + 0x50);
LAB_00129981:
    sVar4 = nni_aio_count(pnVar1);
    *plVar5 = *plVar5 + sVar4;
  }
  else if (*(ulong *)((long)arg + 0x58) < *(ulong *)((long)arg + 0x68)) {
    plVar5 = (long *)((long)arg + 0x58);
    goto LAB_00129981;
  }
  uVar2 = *(ulong *)((long)arg + 0x50);
  iov.iov_buf = (void *)(*(ulong *)((long)arg + 0x60) - uVar2);
  if (*(ulong *)((long)arg + 0x60) < uVar2 || iov.iov_buf == (void *)0x0) {
    uVar2 = *(ulong *)((long)arg + 0x58);
    iov.iov_buf = (void *)(*(ulong *)((long)arg + 0x68) - uVar2);
    if (*(ulong *)((long)arg + 0x68) < uVar2 || iov.iov_buf == (void *)0x0) {
      nVar3 = NNG_EPROTO;
      if ((((*(char *)((long)arg + 0x48) == '\0') && (*(char *)((long)arg + 0x49) == 'S')) &&
          (*(char *)((long)arg + 0x4a) == 'P')) &&
         (((*(char *)((long)arg + 0x4b) == '\0' && (*(char *)((long)arg + 0x4e) == '\0')) &&
          (*(char *)((long)arg + 0x4f) == '\0')))) {
        *(ushort *)((long)arg + 0x10) =
             *(ushort *)((long)arg + 0x4c) << 8 | *(ushort *)((long)arg + 0x4c) >> 8;
        nni_list_remove(&ep->negopipes,arg);
        nni_list_append(&ep->waitpipes,arg);
        tcptran_ep_match(ep);
        nni_mtx_unlock(&ep->mtx);
        return;
      }
LAB_00129903:
      nni_list_remove(&ep->negopipes,arg);
      nng_stream_close(*arg);
      pnVar1 = ep->useraio;
      if (pnVar1 != (nni_aio *)0x0) {
        result = NNG_ECONNSHUT;
        if (nVar3 != NNG_ECLOSED) {
          result = nVar3;
        }
        ep->useraio = (nni_aio *)0x0;
        nni_aio_finish_error(pnVar1,result);
      }
      nni_mtx_unlock(&ep->mtx);
      nni_pipe_close(*(nni_pipe **)((long)arg + 8));
      nni_pipe_rele(*(nni_pipe **)((long)arg + 8));
      return;
    }
    local_38 = (undefined1  [8])((long)arg + uVar2 + 0x48);
    nni_aio_set_iov(pnVar1,1,(nni_iov *)local_38);
    nng_stream_recv(*arg,pnVar1);
  }
  else {
    local_38 = (undefined1  [8])((long)arg + uVar2 + 0x40);
    nni_aio_set_iov(pnVar1,1,(nni_iov *)local_38);
    nng_stream_send(*arg,pnVar1);
  }
  nni_mtx_unlock(&ep->mtx);
  return;
}

Assistant:

static void
tcptran_pipe_nego_cb(void *arg)
{
	tcptran_pipe *p   = arg;
	tcptran_ep   *ep  = p->ep;
	nni_aio      *aio = &p->negoaio;
	nni_aio      *uaio;
	int           rv;

	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	// We start transmitting before we receive.
	if (p->gottxhead < p->wanttxhead) {
		p->gottxhead += nni_aio_count(aio);
	} else if (p->gotrxhead < p->wantrxhead) {
		p->gotrxhead += nni_aio_count(aio);
	}

	if (p->gottxhead < p->wanttxhead) {
		nni_iov iov;
		iov.iov_len = p->wanttxhead - p->gottxhead;
		iov.iov_buf = &p->txlen[p->gottxhead];
		// send it down...
		nni_aio_set_iov(aio, 1, &iov);
		nng_stream_send(p->conn, aio);
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (p->gotrxhead < p->wantrxhead) {
		nni_iov iov;
		iov.iov_len = p->wantrxhead - p->gotrxhead;
		iov.iov_buf = &p->rxlen[p->gotrxhead];
		nni_aio_set_iov(aio, 1, &iov);
		nng_stream_recv(p->conn, aio);
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	// We have both sent and received the headers.  Let's check the
	// receiver.
	if ((p->rxlen[0] != 0) || (p->rxlen[1] != 'S') ||
	    (p->rxlen[2] != 'P') || (p->rxlen[3] != 0) || (p->rxlen[6] != 0) ||
	    (p->rxlen[7] != 0)) {
		rv = NNG_EPROTO;
		goto error;
	}

	NNI_GET16(&p->rxlen[4], p->peer);

	// We are ready now.  We put this in the wait list, and
	// then try to run the matcher.
	nni_list_remove(&ep->negopipes, p);
	nni_list_append(&ep->waitpipes, p);

	tcptran_ep_match(ep);
	nni_mtx_unlock(&ep->mtx);

	return;

error:
	// If the connection is closed, we need to pass back a different
	// error code.  This is necessary to avoid a problem where the
	// closed status is confused with the accept file descriptor
	// being closed.
	if (rv == NNG_ECLOSED) {
		rv = NNG_ECONNSHUT;
	}
	nni_list_remove(&ep->negopipes, p);
	nng_stream_close(p->conn);

	if ((uaio = ep->useraio) != NULL) {
		ep->useraio = NULL;
		nni_aio_finish_error(uaio, rv);
	}
	nni_mtx_unlock(&ep->mtx);

	nni_pipe_close(p->npipe);
	nni_pipe_rele(p->npipe);
}